

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uconv.h
# Opt level: O2

string_type * __thiscall
booster::locale::impl_icu::icu_std_converter<wchar_t,4>::std_abi_cxx11_
          (string_type *__return_storage_ptr__,void *this,UnicodeString *str)

{
  pointer pwVar1;
  size_type sVar2;
  char16_t *pcVar3;
  int iVar4;
  UErrorCode code;
  int32_t len;
  undefined8 local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::wstring::resize((ulong)__return_storage_ptr__);
  pwVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_28 = 0;
  sVar2 = __return_storage_ptr__->_M_string_length;
  pcVar3 = icu_70::UnicodeString::getBuffer(str);
  if (*(short *)(str + 8) < 0) {
    iVar4 = *(int *)(str + 0xc);
  }
  else {
    iVar4 = (int)*(short *)(str + 8) >> 5;
  }
  u_strToUTF32_70(pwVar1,(int)sVar2,(long)&local_28 + 4,pcVar3,iVar4,&local_28);
  check_and_throw_icu_error((UErrorCode)local_28);
  std::__cxx11::wstring::resize((ulong)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string_type std(icu::UnicodeString const &str) const
        {
            string_type tmp;
            tmp.resize(str.length());
            UChar32 *ptr=reinterpret_cast<UChar32 *>(&tmp[0]);

            #ifdef __SUNPRO_CC
            int len=0;
            #else
            ::int32_t len=0;
            #endif

            UErrorCode code=U_ZERO_ERROR;
            u_strToUTF32(ptr,tmp.size(),&len,str.getBuffer(),str.length(),&code);

            check_and_throw_icu_error(code);

            tmp.resize(len);

            return tmp;
        }